

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O2

void __thiscall wasm::InlineMainPass::run(InlineMainPass *this,Module *module)

{
  Expression **ppEVar1;
  char *pcVar2;
  Function *into;
  Function *pFVar3;
  Call *pCVar4;
  Expression **ppEVar5;
  undefined1 auVar6 [8];
  string_view local_98;
  string_view local_88;
  undefined1 local_78 [8];
  FindAllPointers<wasm::Call> calls;
  char *local_58;
  
  Name::Name((Name *)&local_98,"main");
  into = Module::getFunctionOrNull(module,(Name)local_98);
  Name::Name((Name *)&local_88,"__original_main");
  pFVar3 = Module::getFunctionOrNull(module,(Name)local_88);
  if ((((into != (Function *)0x0) && (pFVar3 != (Function *)0x0)) &&
      ((into->super_Importable).module.super_IString.str._M_str == (char *)0x0)) &&
     ((pFVar3->super_Importable).module.super_IString.str._M_str == (char *)0x0)) {
    FindAllPointers<wasm::Call>::FindAllPointers
              ((FindAllPointers<wasm::Call> *)local_78,&into->body);
    ppEVar5 = (Expression **)0x0;
    for (auVar6 = local_78;
        auVar6 != (undefined1  [8])
                  calls.list.
                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        auVar6 = (undefined1  [8])((long)auVar6 + 8)) {
      ppEVar1 = *(Expression ***)auVar6;
      pCVar4 = Expression::cast<wasm::Call>(*ppEVar1);
      IString::IString((IString *)
                       &calls.list.
                        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"__original_main");
      pcVar2 = (pCVar4->target).super_IString.str._M_str;
      if ((pcVar2 == local_58) && (ppEVar5 != (Expression **)0x0)) goto LAB_0088597f;
      if (pcVar2 != local_58 || ppEVar5 != (Expression **)0x0) {
        ppEVar1 = ppEVar5;
      }
      ppEVar5 = ppEVar1;
    }
    if (ppEVar5 != (Expression **)0x0) {
      calls.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppEVar5;
      anon_unknown_225::doInlining
                (module,into,
                 (InliningAction *)
                 &calls.list.
                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 &((this->super_Pass).runner)->options);
    }
LAB_0088597f:
    std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)local_78);
  }
  return;
}

Assistant:

void run(Module* module) override {
    auto* main = module->getFunctionOrNull(MAIN);
    auto* originalMain = module->getFunctionOrNull(ORIGINAL_MAIN);
    if (!main || main->imported() || !originalMain ||
        originalMain->imported()) {
      return;
    }
    FindAllPointers<Call> calls(main->body);
    Expression** callSite = nullptr;
    for (auto* call : calls.list) {
      if ((*call)->cast<Call>()->target == ORIGINAL_MAIN) {
        if (callSite) {
          // More than one call site.
          return;
        }
        callSite = call;
      }
    }
    if (!callSite) {
      // No call at all.
      return;
    }
    doInlining(
      module, main, InliningAction(callSite, originalMain), getPassOptions());
  }